

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUnicode.cpp
# Opt level: O0

void testUnicode(void)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint32 uVar4;
  uint local_40;
  uint32 i;
  undefined1 local_30 [8];
  String str;
  
  String::String((String *)local_30);
  bVar2 = Unicode::append(0x110000,(String *)local_30);
  if ((bVar2) &&
     (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestUnicode.cpp"
                            ,8,"!Unicode::append(0x110000ULL, str)"), iVar3 != 0)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  local_40 = 0;
  while( true ) {
    if (0x10ffff < local_40) {
      String::~String((String *)local_30);
      return;
    }
    String::clear((String *)local_30);
    bVar2 = Unicode::append(local_40,(String *)local_30);
    if ((!bVar2) &&
       (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestUnicode.cpp"
                              ,0x10,"Unicode::append(i, str)"), iVar3 != 0)) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    bVar2 = Unicode::isValid((String *)local_30);
    if ((!bVar2) &&
       (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestUnicode.cpp"
                              ,0x11,"Unicode::isValid(str)"), iVar3 != 0)) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    uVar4 = Unicode::fromString((String *)local_30);
    if ((uVar4 != local_40) &&
       (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestUnicode.cpp"
                              ,0x12,"Unicode::fromString(str) == i"), iVar3 != 0)) break;
    local_40 = local_40 + 100;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void testUnicode()
{
  String str;
  ASSERT(!Unicode::append(0x110000ULL, str));
  for(uint32 i = 0; i < 0x110000ULL; i += 100)
  {
#ifdef _UNICODE
    if(i >= 0xD800 && i <= 0xDFFF)
      continue;
#endif
    str.clear();
    ASSERT(Unicode::append(i, str));
    ASSERT(Unicode::isValid(str));
    ASSERT(Unicode::fromString(str) == i);
  }
}